

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.cpp
# Opt level: O3

bool __thiscall booster::log::logger::should_be_logged(logger *this,level_type level,char *module)

{
  int iVar1;
  level_type lVar2;
  char *__s1;
  entry *peVar3;
  
  lVar2 = this->default_level_;
  __s1 = this->entries_[0].module;
  if (__s1 != (char *)0x0) {
    peVar3 = this->entries_;
    do {
      peVar3 = peVar3 + 1;
      iVar1 = strcmp(__s1,module);
      if (iVar1 == 0) {
        lVar2 = peVar3[-1].level;
        break;
      }
      __s1 = peVar3->module;
    } while (__s1 != (char *)0x0);
  }
  return (int)level <= (int)lVar2;
}

Assistant:

bool logger::should_be_logged(level_type level,char const *module)
	{
		level_type module_level = default_level_;
		for(entry *p=entries_;p->module;p++) {
			if(strcmp(p->module,module)==0) {
				module_level=p->level;
				break;
			}
		}
		return level <= module_level;
	}